

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_memprof.c
# Opt level: O2

void * memprof_allocf(void *ud,void *ptr,size_t osize,size_t nsize)

{
  int iVar1;
  void *pvVar2;
  uint8_t aevent;
  void *pvVar3;
  
  pvVar3 = ptr;
  pvVar2 = (*memprof.orig_alloc.allocf)(ud,ptr,osize,nsize);
  aevent = (uint8_t)pvVar3;
  if (nsize == 0) {
    memprof_write_caller((memprof *)0x2,aevent);
  }
  else if (ptr == (void *)0x0) {
    memprof_write_caller((memprof *)0x1,aevent);
    osize = nsize;
    ptr = pvVar2;
  }
  else {
    memprof_write_caller((memprof *)0x3,aevent);
    lj_wbuf_addu64(&memprof.out,(uint64_t)ptr);
    lj_wbuf_addu64(&memprof.out,osize);
    osize = nsize;
    ptr = pvVar2;
  }
  lj_wbuf_addu64(&memprof.out,(uint64_t)ptr);
  lj_wbuf_addu64(&memprof.out,osize);
  iVar1 = lj_wbuf_test_flag(&memprof.out,'\x02');
  if (iVar1 != 0) {
    lj_memprof_stop((lua_State *)(ulong)((memprof.g)->mainthref).gcptr32);
  }
  return pvVar2;
}

Assistant:

static void *memprof_allocf(void *ud, void *ptr, size_t osize, size_t nsize)
{
  struct memprof *mp = &memprof;
  const struct alloc *oalloc = &mp->orig_alloc;
  struct lj_wbuf *out = &mp->out;
  void *nptr;

  lj_assertX(MPS_PROFILE == mp->state, "bad memprof profile state");
  lj_assertX(oalloc->allocf != memprof_allocf,
	     "unexpected memprof old alloc function");
  lj_assertX(oalloc->allocf != NULL,
	     "uninitialized memprof old alloc function");
  lj_assertX(ud == oalloc->state, "bad old memprof profile state");

  nptr = oalloc->allocf(ud, ptr, osize, nsize);

  if (nsize == 0) {
    memprof_write_caller(mp, AEVENT_FREE);
    lj_wbuf_addu64(out, (uintptr_t)ptr);
    lj_wbuf_addu64(out, (uint64_t)osize);
  } else if (ptr == NULL) {
    memprof_write_caller(mp, AEVENT_ALLOC);
    lj_wbuf_addu64(out, (uintptr_t)nptr);
    lj_wbuf_addu64(out, (uint64_t)nsize);
  } else {
    memprof_write_caller(mp, AEVENT_REALLOC);
    lj_wbuf_addu64(out, (uintptr_t)ptr);
    lj_wbuf_addu64(out, (uint64_t)osize);
    lj_wbuf_addu64(out, (uintptr_t)nptr);
    lj_wbuf_addu64(out, (uint64_t)nsize);
  }

  /* Deinstrument memprof if required. */
  if (LJ_UNLIKELY(lj_wbuf_test_flag(out, STREAM_STOP)))
    lj_memprof_stop(mainthread(mp->g));

  return nptr;
}